

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O2

int inet_ntop6(uchar *src,char *dst,size_t size)

{
  int iVar1;
  size_t sVar2;
  int local_9c;
  int err;
  int i;
  uint words [8];
  int local_70;
  int iStack_6c;
  anon_struct_8_2_6202816b cur;
  anon_struct_8_2_6202816b best;
  char *tp;
  char tmp [46];
  size_t size_local;
  char *dst_local;
  uchar *src_local;
  
  unique0x10000266 = size;
  memset(&err,0,0x20);
  for (local_9c = 0; local_9c < 0x10; local_9c = local_9c + 1) {
    (&err)[local_9c / 2] =
         (uint)src[local_9c] << (('\x01' - (char)(local_9c % 2)) * '\b' & 0x1fU) |
         (&err)[local_9c / 2];
  }
  cur.base = -1;
  cur.len = 0;
  local_70 = -1;
  iStack_6c = 0;
  local_9c = 0;
  while( true ) {
    if (7 < local_9c) break;
    if ((&err)[local_9c] == 0) {
      if (local_70 == -1) {
        local_70 = local_9c;
        iStack_6c = 1;
      }
      else {
        iStack_6c = iStack_6c + 1;
      }
    }
    else if (local_70 != -1) {
      if ((cur.base == -1) || (cur.len < iStack_6c)) {
        cur.len = iStack_6c;
        cur.base = local_70;
      }
      local_70 = -1;
    }
    local_9c = local_9c + 1;
  }
  if ((local_70 != -1) && ((cur.base == -1 || (cur.len < iStack_6c)))) {
    cur.len = iStack_6c;
    cur.base = local_70;
  }
  if ((cur.base != -1) && (cur.len < 2)) {
    cur.base = -1;
  }
  best = (anon_struct_8_2_6202816b)&tp;
  local_9c = 0;
  do {
    if (7 < local_9c) {
LAB_0012d0f7:
      if ((cur.base != -1) && (cur.base + cur.len == 8)) {
        *(undefined1 *)best = 0x3a;
        best = (anon_struct_8_2_6202816b)((long)best + 1);
      }
      *(undefined1 *)best = 0;
      if (stack0xffffffffffffffd8 < (ulong)(((long)best + 1) - (long)&tp)) {
        src_local._4_4_ = -0x1c;
      }
      else {
        uv__strscpy(dst,(char *)&tp,stack0xffffffffffffffd8);
        src_local._4_4_ = 0;
      }
      return src_local._4_4_;
    }
    if (((cur.base == -1) || (local_9c < cur.base)) || (cur.base + cur.len <= local_9c)) {
      if (local_9c != 0) {
        *(undefined1 *)best = 0x3a;
        best = (anon_struct_8_2_6202816b)((long)best + 1);
      }
      if (((local_9c == 6) && (cur.base == 0)) &&
         (((cur.len == 6 || ((cur.len == 7 && (words[5] != 1)))) ||
          ((cur.len == 5 && (words[3] == 0xffff)))))) {
        iVar1 = inet_ntop4(src + 0xc,(char *)best,0x2e - ((long)best - (long)&tp));
        if (iVar1 != 0) {
          return iVar1;
        }
        sVar2 = strlen((char *)best);
        best = (anon_struct_8_2_6202816b)(sVar2 + (long)best);
        goto LAB_0012d0f7;
      }
      iVar1 = snprintf((char *)best,0x2e - ((long)best - (long)&tp),"%x",
                       (ulong)(uint)(&err)[local_9c]);
      best = (anon_struct_8_2_6202816b)((long)best + (long)iVar1);
    }
    else if (local_9c == cur.base) {
      *(undefined1 *)best = 0x3a;
      best = (anon_struct_8_2_6202816b)((long)best + 1);
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

static int inet_ntop6(const unsigned char *src, char *dst, size_t size) {
  /*
   * Note that int32_t and int16_t need only be "at least" large enough
   * to contain a value of the specified size.  On some systems, like
   * Crays, there is no such thing as an integer variable with 16 bits.
   * Keep this in mind if you think this function should have been coded
   * to use pointer overlays.  All the world's not a VAX.
   */
  char tmp[UV__INET6_ADDRSTRLEN], *tp;
  struct { int base, len; } best, cur;
  unsigned int words[sizeof(struct in6_addr) / sizeof(uint16_t)];
  int i;

  /*
   * Preprocess:
   *  Copy the input (bytewise) array into a wordwise array.
   *  Find the longest run of 0x00's in src[] for :: shorthanding.
   */
  memset(words, '\0', sizeof words);
  for (i = 0; i < (int) sizeof(struct in6_addr); i++)
    words[i / 2] |= (src[i] << ((1 - (i % 2)) << 3));
  best.base = -1;
  best.len = 0;
  cur.base = -1;
  cur.len = 0;
  for (i = 0; i < (int) ARRAY_SIZE(words); i++) {
    if (words[i] == 0) {
      if (cur.base == -1)
        cur.base = i, cur.len = 1;
      else
        cur.len++;
    } else {
      if (cur.base != -1) {
        if (best.base == -1 || cur.len > best.len)
          best = cur;
        cur.base = -1;
      }
    }
  }
  if (cur.base != -1) {
    if (best.base == -1 || cur.len > best.len)
      best = cur;
  }
  if (best.base != -1 && best.len < 2)
    best.base = -1;

  /*
   * Format the result.
   */
  tp = tmp;
  for (i = 0; i < (int) ARRAY_SIZE(words); i++) {
    /* Are we inside the best run of 0x00's? */
    if (best.base != -1 && i >= best.base &&
        i < (best.base + best.len)) {
      if (i == best.base)
        *tp++ = ':';
      continue;
    }
    /* Are we following an initial run of 0x00s or any real hex? */
    if (i != 0)
      *tp++ = ':';
    /* Is this address an encapsulated IPv4? */
    if (i == 6 && best.base == 0 && (best.len == 6 ||
        (best.len == 7 && words[7] != 0x0001) ||
        (best.len == 5 && words[5] == 0xffff))) {
      int err = inet_ntop4(src+12, tp, sizeof tmp - (tp - tmp));
      if (err)
        return err;
      tp += strlen(tp);
      break;
    }
    tp += snprintf(tp, sizeof tmp - (tp - tmp), "%x", words[i]);
  }
  /* Was it a trailing run of 0x00's? */
  if (best.base != -1 && (best.base + best.len) == ARRAY_SIZE(words))
    *tp++ = ':';
  *tp++ = '\0';
  if ((size_t) (tp - tmp) > size)
    return UV_ENOSPC;
  uv__strscpy(dst, tmp, size);
  return 0;
}